

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

void __thiscall node::BlockManager::CleanupBlockRevFiles(BlockManager *this)

{
  _Rb_tree_header *p_Var1;
  size_type sVar2;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var3;
  path path_00;
  char cVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  path *ppVar8;
  long lVar9;
  path *ppVar10;
  mapped_type *this_00;
  _Base_ptr p_Var11;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view str;
  string_view source_file;
  directory_iterator it;
  string path;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  mapBlockFiles;
  Level in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  element_type *in_stack_fffffffffffffec0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffed0 [16];
  path local_100;
  path local_d8;
  path local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  logging_function._M_str = "CleanupBlockRevFiles";
  logging_function._M_len = 0x14;
  source_file._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
  ;
  source_file._M_len = 0x5e;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  ::LogPrintf_<>(logging_function,source_file,0x27c,
                 IPC|RAND|ADDRMAN|ESTIMATEFEE|RPC|WALLETDB|BENCH|MEMPOOL|TOR|NET,
                 in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffec0);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&stack0xfffffffffffffec0,(path *)&(this->m_opts).blocks_dir,none,
             (error_code *)0x0);
  if (in_stack_fffffffffffffec8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    do {
      ppVar8 = (path *)std::filesystem::__cxx11::directory_iterator::operator*
                                 ((directory_iterator *)&stack0xfffffffffffffec0);
      sVar2 = (ppVar8->_M_pathname)._M_string_length;
      if (sVar2 == 0) {
LAB_0020d5a6:
        std::filesystem::__cxx11::path::path(&local_d8);
      }
      else {
        _Var3._M_head_impl =
             (ppVar8->_M_cmpts)._M_impl._M_t.
             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             ._M_t.
             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
             _M_head_impl;
        uVar5 = (uint)_Var3._M_head_impl;
        if ((~(byte)_Var3._M_head_impl & 3) != 0) {
          if ((((ulong)_Var3._M_head_impl & 3) == 0) &&
             ((ppVar8->_M_pathname)._M_dataplus._M_p[sVar2 - 1] != '/')) {
            if (((ulong)_Var3._M_head_impl & 3) == 0) {
              lVar9 = std::filesystem::__cxx11::path::_List::end();
              if (((ulong)(ppVar8->_M_cmpts)._M_impl._M_t.
                          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          .
                          super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                          ._M_head_impl & 3) == 0) {
                ppVar8 = (path *)(lVar9 + -0x30);
              }
              uVar5 = (uint)(ppVar8->_M_cmpts)._M_impl._M_t.
                            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            .
                            super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                            ._M_head_impl;
            }
            if ((~uVar5 & 3) == 0) goto LAB_0020d599;
          }
          goto LAB_0020d5a6;
        }
LAB_0020d599:
        std::filesystem::__cxx11::path::path(&local_d8,ppVar8);
      }
      std::filesystem::__cxx11::path::path(&local_b0,&local_d8);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,local_b0._M_pathname._M_dataplus._M_p,
                 local_b0._M_pathname._M_dataplus._M_p + local_b0._M_pathname._M_string_length);
      std::filesystem::__cxx11::path::~path(&local_b0);
      std::filesystem::__cxx11::path::~path(&local_d8);
      ppVar10 = (path *)std::filesystem::__cxx11::directory_iterator::operator*
                                  ((directory_iterator *)&stack0xfffffffffffffec0);
      cVar4 = std::filesystem::status(ppVar10);
      if ((cVar4 == '\x01') && (local_88._M_string_length == 0xc)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_b0._M_pathname,&local_88,8,4);
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_b0._M_pathname,".dat");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
          operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                          local_b0._M_pathname.field_2._M_allocated_capacity + 1);
        }
        if (iVar6 == 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_b0._M_pathname,&local_88,0,3);
          iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_b0._M_pathname,"blk");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
            operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                            local_b0._M_pathname.field_2._M_allocated_capacity + 1);
          }
          if (iVar6 == 0) {
            ppVar8 = (path *)std::filesystem::__cxx11::directory_iterator::operator*
                                       ((directory_iterator *)&stack0xfffffffffffffec0);
            std::filesystem::__cxx11::path::path(&local_100,ppVar8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_b0._M_pathname,&local_88,3,5);
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
                                    *)&local_68,&local_b0._M_pathname);
            path_00._M_pathname._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffebc;
            path_00._M_pathname._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffeb8;
            path_00._M_pathname._M_string_length = (size_type)in_stack_fffffffffffffec0;
            path_00._M_pathname.field_2._M_allocated_capacity =
                 (size_type)in_stack_fffffffffffffec8._M_pi;
            path_00._24_16_ = in_stack_fffffffffffffed0;
            fs::path::operator=(this_00,path_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
              operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                              local_b0._M_pathname.field_2._M_allocated_capacity + 1);
            }
            std::filesystem::__cxx11::path::~path(&local_100);
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_b0._M_pathname,&local_88,0,3);
            iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_b0._M_pathname,"rev");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
              operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                              local_b0._M_pathname.field_2._M_allocated_capacity + 1);
            }
            if (iVar6 == 0) {
              ppVar10 = (path *)std::filesystem::__cxx11::directory_iterator::operator*
                                          ((directory_iterator *)&stack0xfffffffffffffec0);
              std::filesystem::remove(ppVar10);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::directory_iterator::operator++
                ((__directory_iterator_proxy *)&stack0xfffffffffffffed0,
                 (directory_iterator *)&stack0xfffffffffffffec0,0);
      std::filesystem::__cxx11::path::~path((path *)&stack0xfffffffffffffed0);
    } while (in_stack_fffffffffffffec8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
    ;
  }
  p_Var1 = &local_68._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    iVar6 = 0;
    p_Var11 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      str._M_str = *(char **)(p_Var11 + 1);
      str._M_len = (size_t)p_Var11[1]._M_parent;
      iVar7 = LocaleIndependentAtoi<int>(str);
      if (iVar7 == iVar6) {
        iVar6 = iVar6 + 1;
      }
      else {
        std::filesystem::remove((path *)(p_Var11 + 2));
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BlockManager::CleanupBlockRevFiles() const
{
    std::map<std::string, fs::path> mapBlockFiles;

    // Glob all blk?????.dat and rev?????.dat files from the blocks directory.
    // Remove the rev files immediately and insert the blk file paths into an
    // ordered map keyed by block file index.
    LogPrintf("Removing unusable blk?????.dat and rev?????.dat files for -reindex with -prune\n");
    for (fs::directory_iterator it(m_opts.blocks_dir); it != fs::directory_iterator(); it++) {
        const std::string path = fs::PathToString(it->path().filename());
        if (fs::is_regular_file(*it) &&
            path.length() == 12 &&
            path.substr(8,4) == ".dat")
        {
            if (path.substr(0, 3) == "blk") {
                mapBlockFiles[path.substr(3, 5)] = it->path();
            } else if (path.substr(0, 3) == "rev") {
                remove(it->path());
            }
        }
    }

    // Remove all block files that aren't part of a contiguous set starting at
    // zero by walking the ordered map (keys are block file indices) by
    // keeping a separate counter.  Once we hit a gap (or if 0 doesn't exist)
    // start removing block files.
    int nContigCounter = 0;
    for (const std::pair<const std::string, fs::path>& item : mapBlockFiles) {
        if (LocaleIndependentAtoi<int>(item.first) == nContigCounter) {
            nContigCounter++;
            continue;
        }
        remove(item.second);
    }
}